

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O1

void __thiscall NaStateSpaceModel::Reset(NaStateSpaceModel *this)

{
  NaVector *this_00;
  uint uVar1;
  uint uVar2;
  undefined4 *puVar3;
  EVP_PKEY_CTX *src;
  NaVector *this_01;
  
  this_00 = &this->x;
  NaVector::new_dim(this_00,this->n);
  this_01 = &this->x0;
  uVar1 = NaVector::dim(this_01);
  if (uVar1 == 0) {
    NaVector::init_zero(this_00);
    return;
  }
  uVar1 = NaVector::dim(this_01);
  uVar2 = NaVector::dim(this_00);
  if (uVar1 == uVar2) {
    NaVector::copy(this_00,(EVP_PKEY_CTX *)this_01,src);
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 2;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaStateSpaceModel::Reset ()
{
    x.new_dim(n);
    if(x0.dim() == 0)
	x.init_zero();
    else if(x0.dim() == x.dim())
	x.copy(x0);
    else
	throw(na_size_mismatch);
}